

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian.c
# Opt level: O0

uint64_t readUint64InLittleEndian(void *memory)

{
  uint8_t *p;
  void *memory_local;
  
  return (ulong)*(byte *)((long)memory + 7) << 0x38 | (ulong)*(byte *)((long)memory + 6) << 0x30 |
         (ulong)*(byte *)((long)memory + 5) << 0x28 | (ulong)*(byte *)((long)memory + 4) << 0x20 |
         (ulong)*(byte *)((long)memory + 3) << 0x18 | (ulong)*(byte *)((long)memory + 2) << 0x10 |
         (ulong)*(byte *)((long)memory + 1) << 8 | (ulong)*memory;
}

Assistant:

uint64_t readUint64InLittleEndian(void* memory)
{
	uint8_t* p = memory;
	return (((uint64_t)p[7]) << 56) | 
		   (((uint64_t)p[6]) << 48) |
		   (((uint64_t)p[5]) << 40) |
		   (((uint64_t)p[4]) << 32) |
		   (((uint64_t)p[3]) << 24) | 
		   (((uint64_t)p[2]) << 16) |
		   (((uint64_t)p[1]) <<  8) |
		   (((uint64_t)p[0]));
}